

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int add_conterexample(saucy *s,sim_result *cex)

{
  Vec_Ptr_t *p;
  int extraout_EAX;
  ulong uVar1;
  void *pvVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  
  uVar3 = s->pNtk->vPis->nSize;
  cex->inVecSignature = 0;
  uVar4 = 0;
  uVar1 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar1 = uVar4;
  }
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    if (cex->inVec[uVar5] != 0) {
      uVar3 = (int)uVar4 + (int)uVar5 * (int)uVar5 * cex->inVec[uVar5] ^ 0xabcd;
      uVar4 = (ulong)uVar3;
      cex->inVecSignature = uVar3;
    }
  }
  i = 0;
  do {
    p = s->satCounterExamples;
    if (p->nSize <= i) {
      Vec_PtrPush(p,cex);
      bumpActivity(s,cex);
      return extraout_EAX;
    }
    pvVar2 = Vec_PtrEntry(p,i);
    i = i + 1;
  } while (*(int *)((long)pvVar2 + 0x10) != cex->inVecSignature);
  return *(int *)((long)pvVar2 + 0x10);
}

Assistant:

static int
add_conterexample(struct saucy *s, struct sim_result * cex)
{
    int i;
    int nins = Abc_NtkPiNum(s->pNtk);
    struct sim_result * savedcex;
    
    cex->inVecSignature = 0;
    for (i = 0; i < nins; i++) {
        if (cex->inVec[i]) {
            cex->inVecSignature += (cex->inVec[i] * i * i);
            cex->inVecSignature ^= 0xABCD;
        }
    }

    for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
        savedcex = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
        if (savedcex->inVecSignature == cex->inVecSignature) {
            //bumpActivity(s, savedcex);
            return 0;
        }
    }
    
    Vec_PtrPush(s->satCounterExamples, cex);
    bumpActivity(s, cex);
    return 1;
}